

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
account_growing_inode<(unodb::node_type)1>
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  reference pvVar1;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  
  pvVar1 = std::array<std::atomic<unsigned_long>,_4UL>::operator[](&this->growing_inode_counts,0);
  LOCK();
  (pvVar1->super___atomic_base<unsigned_long>)._M_i =
       (pvVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

constexpr void olc_db<Key, Value>::account_growing_inode() noexcept {
  static_assert(NodeType != node_type::LEAF);

  // NOLINTNEXTLINE(google-readability-casting)
  growing_inode_counts[internal_as_i<NodeType>].fetch_add(
      1, std::memory_order_relaxed);
}